

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O3

void m_respond(monst *mtmp)

{
  uint uVar1;
  char *pcVar2;
  long lVar3;
  permonst *ppVar4;
  
  ppVar4 = mtmp->data;
  if (ppVar4->msound == '\x0f') {
    if (flags.soundok != '\0') {
      pcVar2 = Monnam(mtmp);
      pline("%s shrieks.",pcVar2);
      stop_occupation();
    }
    uVar1 = mt_random();
    if ((uVar1 * -0x33333333 >> 1 | (uint)((uVar1 * -0x33333333 & 1) != 0) << 0x1f) < 0x1999999a) {
      uVar1 = mt_random();
      if (uVar1 * -0x3b13b13b < 0x13b13b14) {
        ppVar4 = mons + 0x77;
      }
      else {
        ppVar4 = (permonst *)0x0;
      }
      makemon(ppVar4,level,0,0,0);
    }
    aggravate();
    ppVar4 = mtmp->data;
  }
  if (ppVar4 == mons + 0x127) {
    lVar3 = 0;
    do {
      if ((&mons[0x127].mattk[0].aatyp)[lVar3] == '\x0f') {
        gazemu(mtmp,(attack *)(&mons[0x127].mattk[0].aatyp + lVar3));
        return;
      }
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x18);
  }
  return;
}

Assistant:

void m_respond(struct monst *mtmp)
{
    if (mtmp->data->msound == MS_SHRIEK) {
	if (flags.soundok) {
	    pline("%s shrieks.", Monnam(mtmp));
	    stop_occupation();
	}
	if (!rn2(10)) {
	    if (!rn2(13))
		makemon(&mons[PM_PURPLE_WORM], level, 0, 0, NO_MM_FLAGS);
	    else
		makemon(NULL, level, 0, 0, NO_MM_FLAGS);

	}
	aggravate();
    }
    if (mtmp->data == &mons[PM_MEDUSA]) {
	int i;
	for (i = 0; i < NATTK; i++)
	     if (mtmp->data->mattk[i].aatyp == AT_GAZE) {
		 gazemu(mtmp, &mtmp->data->mattk[i]);
		 break;
	     }
    }
}